

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O2

bool run_olc_editor(DESCRIPTOR_DATA *d)

{
  switch(d->editor) {
  case 1:
    aedit(d->character,d->incomm);
    break;
  case 2:
    redit(d->character,d->incomm);
    break;
  case 3:
    oedit(d->character,d->incomm);
    break;
  case 4:
    medit(d->character,d->incomm);
    break;
  default:
    return false;
  }
  return true;
}

Assistant:

bool run_olc_editor(DESCRIPTOR_DATA *d)
{
	switch (d->editor)
	{
		case ED_AREA:
			aedit(d->character, d->incomm);
			break;
		case ED_ROOM:
			redit(d->character, d->incomm);
			break;
		case ED_OBJECT:
			oedit(d->character, d->incomm);
			break;
		case ED_MOBILE:
			medit(d->character, d->incomm);
			break;
		default:
			return false;
	}

	return true;
}